

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDateTime QDateTime::fromString(QString *string,QStringView format,int baseYear,QCalendar cal)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  Data in_RDI;
  long in_FS_OFFSET;
  QDateTimeParser dt;
  QDateTime datetime;
  QStringView in_stack_00000240;
  QDateTime *in_stack_fffffffffffffea8;
  QDateTimeParser *in_stack_fffffffffffffeb0;
  int baseYear_00;
  Context in_stack_fffffffffffffee8;
  Type in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  QCalendar in_stack_fffffffffffffef8;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QDateTimeParser *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDateTime((QDateTime *)0x5744b4);
  baseYear_00 = -0x55555556;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  this = (QDateTimeParser *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  pvVar3 = (void *)0x10;
  QDateTimeParser::QDateTimeParser
            ((QDateTimeParser *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,in_stack_fffffffffffffef8);
  QLocale::c(local_d8,pvVar3);
  QDateTimeParser::setDefaultLocale(in_stack_fffffffffffffeb0,(QLocale *)in_stack_fffffffffffffea8);
  QLocale::~QLocale((QLocale *)0x574576);
  bVar2 = QDateTimeParser::parseFormat(this,in_stack_00000240);
  if ((!bVar2) ||
     ((bVar2 = QDateTimeParser::fromString
                         ((QDateTimeParser *)in_stack_fffffffffffffef8.d_ptr,
                          (QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (QDateTime *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                          ,baseYear_00), !bVar2 &&
      (bVar2 = isValid((QDateTime *)in_stack_fffffffffffffeb0), bVar2)))) {
    QDateTime((QDateTime *)0x57466a);
  }
  else {
    QDateTime((QDateTime *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  QDateTimeParser::~QDateTimeParser(in_stack_fffffffffffffeb0);
  ~QDateTime((QDateTime *)0x57468c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDateTime)in_RDI;
}

Assistant:

QDateTime QDateTime::fromString(const QString &string, QStringView format, int baseYear,
                                QCalendar cal)
{
#if QT_CONFIG(datetimeparser)
    QDateTime datetime;

    QDateTimeParser dt(QMetaType::QDateTime, QDateTimeParser::FromString, cal);
    dt.setDefaultLocale(QLocale::c());
    if (dt.parseFormat(format) && (dt.fromString(string, &datetime, baseYear)
                                   || !datetime.isValid())) {
        return datetime;
    }
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
    Q_UNUSED(baseYear);
    Q_UNUSED(cal);
#endif
    return QDateTime();
}